

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void __thiscall ring_buffer<int>::push_back(ring_buffer<int> *this,int *value)

{
  ulong uVar1;
  size_t sVar2;
  runtime_error *this_00;
  
  uVar1 = this->capacity;
  if (uVar1 != 0) {
    if (this->sz == uVar1) {
      this->first = (this->first + 1) % uVar1;
    }
    else {
      this->sz = this->sz + 1;
    }
    sVar2 = this->pos;
    (this->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar2] = *value;
    this->pos = (sVar2 + 1) % uVar1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ring buffer: capacity is zero");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void push_back(const T & value) {
        if (capacity == 0) {
            throw std::runtime_error("ring buffer: capacity is zero");
        }

        if (sz == capacity) {
            // advance the start when buffer is full
            first = (first + 1) % capacity;
        } else {
            sz++;
        }
        data[pos] = value;
        pos = (pos + 1) % capacity;
    }